

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTInflateMap.cpp
# Opt level: O2

void __thiscall
TTD::TTDCompareMap::CheckConsistentAndAddPtrIdMapping_NoEnqueue
          (TTDCompareMap *this,TTD_PTR_ID h1PtrId,TTD_PTR_ID h2PtrId)

{
  BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  bool bVar1;
  unsigned_long uVar2;
  TTD_PTR_ID local_30;
  TTD_PTR_ID h2PtrId_local;
  TTD_PTR_ID h1PtrId_local;
  
  local_30 = h2PtrId;
  h2PtrId_local = h1PtrId;
  if (h1PtrId == 0 || h2PtrId == 0) {
    DiagnosticAssert(this,h2PtrId == 0 && h1PtrId == 0);
    return;
  }
  this_00 = &this->H1PtrToH2PtrMap;
  bVar1 = JsUtil::
          BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::ContainsKey(this_00,&h2PtrId_local);
  if (bVar1) {
    uVar2 = JsUtil::
            BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Item(this_00,&h2PtrId_local);
    DiagnosticAssert(this,uVar2 == h2PtrId);
  }
  else {
    JsUtil::
    BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
              ((BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this_00,&h2PtrId_local,&local_30);
  }
  return;
}

Assistant:

void TTDCompareMap::CheckConsistentAndAddPtrIdMapping_NoEnqueue(TTD_PTR_ID h1PtrId, TTD_PTR_ID h2PtrId)
    {
        if(h1PtrId == TTD_INVALID_PTR_ID || h2PtrId == TTD_INVALID_PTR_ID)
        {
            this->DiagnosticAssert(h1PtrId == TTD_INVALID_PTR_ID && h2PtrId == TTD_INVALID_PTR_ID);
        }
        else if(this->H1PtrToH2PtrMap.ContainsKey(h1PtrId))
        {
            this->DiagnosticAssert(this->H1PtrToH2PtrMap.Item(h1PtrId) == h2PtrId);
        }
        else
        {
            this->H1PtrToH2PtrMap.AddNew(h1PtrId, h2PtrId);
        }
    }